

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fRandomShaderTests.cpp
# Opt level: O0

RandomShaderCase *
deqp::gles2::Functional::anon_unknown_1::createRandomShaderCase
          (Context *context,char *description,ProgramParameters *baseParams,deUint32 seed,
          bool vertex,bool fragment)

{
  undefined4 uVar1;
  undefined3 uVar2;
  undefined4 uVar4;
  undefined3 uVar5;
  undefined4 uVar6;
  ulong uVar7;
  RandomShaderCase *this;
  TestContext *testCtx;
  RenderContext *renderCtx;
  char *name;
  string local_c8;
  undefined1 auStack_98 [8];
  ProgramParameters params;
  deUint32 local_24;
  bool fragment_local;
  bool vertex_local;
  ProgramParameters *pPStack_20;
  deUint32 seed_local;
  ProgramParameters *baseParams_local;
  char *description_local;
  Context *context_local;
  undefined7 uVar3;
  
  params._88_8_ = *(undefined8 *)&baseParams->trigonometricBaseWeight;
  params.fragmentParameters._24_8_ = *(undefined8 *)&(baseParams->fragmentParameters).maxSamplers;
  params.fragmentParameters._32_8_ = *(undefined8 *)&baseParams->declarationStatementBaseWeight;
  params.fragmentParameters.maxStatementsPerBlock =
       (baseParams->fragmentParameters).maxCombinedVariableScalars;
  params.fragmentParameters.maxExpressionDepth = (baseParams->fragmentParameters).maxUniformScalars;
  params.fragmentParameters.maxCombinedVariableScalars =
       (baseParams->fragmentParameters).maxInputVariables;
  params.fragmentParameters.maxUniformScalars =
       (int)(baseParams->fragmentParameters).texLookupBaseWeight;
  uVar1 = baseParams->version;
  uVar2 = *(undefined3 *)&(baseParams->vertexParameters).field_0x1;
  uVar4 = (baseParams->vertexParameters).maxStatementDepth;
  uVar3 = CONCAT43(uVar4,uVar2);
  params.vertexParameters._0_8_ =
       *(undefined8 *)&(baseParams->vertexParameters).maxStatementsPerBlock;
  params.vertexParameters.maxStatementsPerBlock =
       (baseParams->vertexParameters).maxCombinedVariableScalars;
  params.vertexParameters.maxExpressionDepth = (baseParams->vertexParameters).maxUniformScalars;
  params.vertexParameters.maxCombinedVariableScalars =
       (baseParams->vertexParameters).maxInputVariables;
  params.vertexParameters.maxUniformScalars =
       (int)(baseParams->vertexParameters).texLookupBaseWeight;
  params.vertexParameters._24_8_ = *(undefined8 *)&(baseParams->vertexParameters).maxSamplers;
  uVar5 = *(undefined3 *)&(baseParams->fragmentParameters).field_0x1;
  uVar6 = (baseParams->fragmentParameters).maxStatementDepth;
  params.vertexParameters._36_4_ = uVar6;
  params.vertexParameters.maxSamplers._1_3_ = uVar5;
  params.fragmentParameters._0_8_ =
       *(undefined8 *)&(baseParams->fragmentParameters).maxStatementsPerBlock;
  auStack_98._4_4_ = uVar1;
  auStack_98._0_4_ = seed;
  uVar7 = CONCAT71(uVar3,vertex);
  params._0_8_ = uVar7 & 0xffffffffffffff01;
  params.vertexParameters.maxSamplers._0_1_ = fragment;
  local_24 = seed;
  pPStack_20 = baseParams;
  baseParams_local = (ProgramParameters *)description;
  description_local = (char *)context;
  this = (RandomShaderCase *)operator_new(0x4d0);
  testCtx = Context::getTestContext((Context *)description_local);
  renderCtx = Context::getRenderContext((Context *)description_local);
  de::toString<unsigned_int>(&local_c8,&local_24);
  name = (char *)std::__cxx11::string::c_str();
  deqp::gls::RandomShaderCase::RandomShaderCase
            (this,testCtx,renderCtx,name,(char *)baseParams_local,(ProgramParameters *)auStack_98);
  std::__cxx11::string::~string((string *)&local_c8);
  return this;
}

Assistant:

gls::RandomShaderCase* createRandomShaderCase (Context& context, const char* description, const rsg::ProgramParameters& baseParams, deUint32 seed, bool vertex, bool fragment)
{
	rsg::ProgramParameters params = baseParams;

	params.seed							= seed;
	params.vertexParameters.randomize	= vertex;
	params.fragmentParameters.randomize	= fragment;

	return new gls::RandomShaderCase(context.getTestContext(), context.getRenderContext(), de::toString(seed).c_str(), description, params);
}